

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_0::GLES2Renderer::render
          (GLES2Renderer *this,int width,int height,Frame *frame)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  pointer pDVar4;
  undefined1 auVar5 [12];
  GLenum GVar6;
  long lVar7;
  size_t drawNdx;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  GLubyte colors [24];
  float local_68;
  float local_64;
  float fStack_60;
  float fStack_5c;
  float fStack_58;
  undefined8 local_54;
  float local_44;
  float fStack_40;
  float local_3c;
  
  lVar7 = 0x16;
  uVar8 = 0;
  while( true ) {
    pDVar4 = (frame->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(frame->draws).
                       super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar4) / 0x18) <= uVar8)
    break;
    iVar2 = *(int *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -0x1a);
    if (iVar2 == 0) {
      (*this->m_gl->enable)(0xc11);
      iVar2 = *(int *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -0x16);
      iVar3 = *(int *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -0x12);
      (*this->m_gl->scissor)
                (iVar2,iVar3,*(int *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -0xe) - iVar2
                 ,*(int *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -10) - iVar3);
      (*this->m_gl->clearColor)
                ((float)*(byte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -6) / 255.0,
                 (float)*(byte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -5) / 255.0,
                 (float)*(byte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -4) / 255.0,1.0);
      (*this->m_gl->clear)(0x4000);
      (*this->m_gl->disable)(0xc11);
    }
    else if (iVar2 == 1) {
      piVar1 = (int *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -0x16);
      auVar9._4_4_ = (float)*piVar1 + (float)*piVar1;
      auVar9._0_4_ = (float)piVar1[1] + (float)piVar1[1];
      auVar9._8_4_ = (float)piVar1[3] + (float)piVar1[3];
      auVar9._12_4_ = (float)piVar1[2] + (float)piVar1[2];
      auVar10._8_8_ = CONCAT44((float)width,(float)height);
      auVar10._0_8_ = CONCAT44((float)width,(float)height);
      auVar10 = divps(auVar9,auVar10);
      local_64 = auVar10._0_4_ + -1.0;
      local_68 = auVar10._4_4_ + -1.0;
      fStack_5c = auVar10._8_4_ + -1.0;
      fStack_58 = auVar10._12_4_ + -1.0;
      auVar11._4_4_ = local_68;
      auVar11._0_4_ = local_68;
      auVar11._8_4_ = local_68;
      auVar11._12_4_ = local_68;
      auVar5._4_8_ = auVar11._8_8_;
      auVar5._0_4_ = local_68;
      auVar12._0_8_ = auVar5._0_8_ << 0x20;
      auVar12._8_4_ = fStack_5c;
      auVar12._12_4_ = fStack_58;
      local_54 = auVar12._8_8_;
      colors[0] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -6);
      colors[1] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -5);
      colors[2] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -4);
      colors[3] = 0xff;
      colors[4] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -6);
      colors[5] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -5);
      colors[6] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -4);
      colors[7] = 0xff;
      colors[8] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -6);
      colors[9] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -5);
      colors[10] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -4);
      colors[0xb] = 0xff;
      colors[0xc] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -6);
      colors[0xd] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -5);
      colors[0xe] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -4);
      colors[0xf] = 0xff;
      colors[0x10] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -6);
      colors[0x11] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -5);
      colors[0x12] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -4);
      colors[0x13] = 0xff;
      colors[0x14] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -6);
      colors[0x15] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -5);
      colors[0x16] = *(GLubyte *)((long)(pDVar4->rect).bottomLeft.m_data + lVar7 + -4);
      colors[0x17] = 0xff;
      fStack_60 = local_68;
      local_44 = local_64;
      fStack_40 = local_68;
      local_3c = local_64;
      (*this->m_gl->useProgram)((this->m_glProgram).m_program.m_program);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glUseProgram() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,0x11a);
      (*this->m_gl->enableVertexAttribArray)(this->m_coordLoc);
      (*this->m_gl->enableVertexAttribArray)(this->m_colorLoc);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"Failed to enable attributes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,0x11e);
      (*this->m_gl->vertexAttribPointer)(this->m_coordLoc,2,0x1406,'\0',0,&local_68);
      (*this->m_gl->vertexAttribPointer)(this->m_colorLoc,4,0x1401,'\x01',0,colors);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"Failed to set attribute pointers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,0x122);
      (*this->m_gl->drawArrays)(4,0,6);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glDrawArrays(), failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,0x125);
      (*this->m_gl->disableVertexAttribArray)(this->m_coordLoc);
      (*this->m_gl->disableVertexAttribArray)(this->m_colorLoc);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"Failed to disable attributes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,0x129);
      (*this->m_gl->useProgram)(0);
      GVar6 = (*this->m_gl->getError)();
      glu::checkError(GVar6,"glUseProgram() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                      ,300);
    }
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 0x18;
  }
  return;
}

Assistant:

void GLES2Renderer::render (int width, int height, const Frame& frame) const
{
	for (size_t drawNdx = 0; drawNdx < frame.draws.size(); drawNdx++)
	{
		const ColoredRect& coloredRect = frame.draws[drawNdx].rect;

		if (frame.draws[drawNdx].drawType == DRAWTYPE_GLES2_RENDER)
		{
			const float x1 = windowToDeviceCoordinates(coloredRect.bottomLeft.x(), width);
			const float y1 = windowToDeviceCoordinates(coloredRect.bottomLeft.y(), height);
			const float x2 = windowToDeviceCoordinates(coloredRect.topRight.x(), width);
			const float y2 = windowToDeviceCoordinates(coloredRect.topRight.y(), height);

			const glw::GLfloat coords[] =
			{
				x1, y1,
				x1, y2,
				x2, y2,

				x2, y2,
				x2, y1,
				x1, y1,
			};

			const glw::GLubyte colors[] =
			{
				coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255,
				coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255,
				coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255,

				coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255,
				coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255,
				coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255,
			};

			m_gl.useProgram(m_glProgram.getProgram());
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() failed");

			m_gl.enableVertexAttribArray(m_coordLoc);
			m_gl.enableVertexAttribArray(m_colorLoc);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "Failed to enable attributes");

			m_gl.vertexAttribPointer(m_coordLoc, 2, GL_FLOAT, GL_FALSE, 0, coords);
			m_gl.vertexAttribPointer(m_colorLoc, 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, colors);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "Failed to set attribute pointers");

			m_gl.drawArrays(GL_TRIANGLES, 0, DE_LENGTH_OF_ARRAY(coords)/2);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDrawArrays(), failed");

			m_gl.disableVertexAttribArray(m_coordLoc);
			m_gl.disableVertexAttribArray(m_colorLoc);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "Failed to disable attributes");

			m_gl.useProgram(0);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() failed");
		}
		else if (frame.draws[drawNdx].drawType == DRAWTYPE_GLES2_CLEAR)
		{
			m_gl.enable(GL_SCISSOR_TEST);
			m_gl.scissor(coloredRect.bottomLeft.x(), coloredRect.bottomLeft.y(),
						 coloredRect.topRight.x()-coloredRect.bottomLeft.x(), coloredRect.topRight.y()-coloredRect.bottomLeft.y());
			m_gl.clearColor(coloredRect.color.x()/255.0f, coloredRect.color.y()/255.0f, coloredRect.color.z()/255.0f, 1.0f);
			m_gl.clear(GL_COLOR_BUFFER_BIT);
			m_gl.disable(GL_SCISSOR_TEST);
		}
		else
			DE_FATAL("Invalid drawtype");
	}
}